

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O1

bool tinyusdz::IsSupportedGeomPrimvarType(uint32_t tyid)

{
  switch(tyid) {
  case 7:
  case 9:
  case 0xe:
  case 0xf:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x1b:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2c:
  case 0x2d:
  case 0x2e:
  case 0x2f:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x3a:
  case 0x3b:
  case 0x3d:
  case 0x3e:
  case 0x3f:
  case 0x40:
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x44:
  case 0x45:
  case 0x46:
  case 0x47:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4c:
  case 0x4d:
  case 0x4e:
switchD_0047fd33_caseD_100007:
    return true;
  case 8:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0x10:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x39:
  case 0x3c:
  case 0x48:
switchD_0047fd33_caseD_100008:
    return false;
  default:
    switch(tyid) {
    case 0x100007:
    case 0x100009:
    case 0x10000e:
    case 0x10000f:
    case 0x100011:
    case 0x100012:
    case 0x100013:
    case 0x100014:
    case 0x100015:
    case 0x100016:
    case 0x10001b:
    case 0x100025:
    case 0x100026:
    case 0x100027:
    case 0x100028:
    case 0x100029:
    case 0x10002a:
    case 0x10002b:
    case 0x10002c:
    case 0x10002d:
    case 0x10002e:
    case 0x10002f:
    case 0x100030:
    case 0x100031:
    case 0x100032:
    case 0x100036:
    case 0x100037:
    case 0x100038:
    case 0x10003a:
    case 0x10003b:
    case 0x10003d:
    case 0x10003e:
    case 0x10003f:
    case 0x100040:
    case 0x100041:
    case 0x100042:
    case 0x100043:
    case 0x100044:
    case 0x100045:
    case 0x100046:
    case 0x100047:
    case 0x100049:
    case 0x10004a:
    case 0x10004b:
    case 0x10004c:
    case 0x10004d:
    case 0x10004e:
      goto switchD_0047fd33_caseD_100007;
    default:
      goto switchD_0047fd33_caseD_100008;
    }
  }
}

Assistant:

bool IsSupportedGeomPrimvarType(uint32_t tyid) {
  //
  // scalar and 1D
  //
#define SUPPORTED_TYPE_FUN(__ty)                                           \
  case value::TypeTraits<__ty>::type_id(): {                                 \
    return true;                                                           \
  }                                                                        \
  case (value::TypeTraits<__ty>::type_id() | value::TYPE_ID_1D_ARRAY_BIT): { \
    return true;                                                           \
  }

  switch (tyid) {
    APPLY_GEOMPRIVAR_TYPE(SUPPORTED_TYPE_FUN)
    default:
      return false;
  }

#undef SUPPORTED_TYPE_FUN
}